

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Lexer::ErrorWriteDetails(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  String lineText;
  String markerText;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_50;
  
  pcVar3 = this->m_start;
  pcVar2 = this->m_current;
  pcVar8 = pcVar3;
  if (pcVar3 < pcVar2) {
    do {
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
      if (cVar1 == '\n') {
        pcVar8 = pcVar3;
      }
      if (cVar1 == '\r') {
        pcVar8 = pcVar3;
      }
    } while (pcVar3 != pcVar2);
  }
  if (pcVar8 < pcVar2) {
    lVar4 = (long)pcVar2 - (long)pcVar8;
    uVar7 = 0;
    do {
      cVar1 = *pcVar8;
      if ((cVar1 != ' ') && (pcVar3 = pcVar8, cVar1 != '\t')) break;
      uVar7 = uVar7 + (ulong)(cVar1 == '\t') * 3 + 1;
      pcVar8 = pcVar8 + 1;
      lVar4 = lVar4 + -1;
      pcVar3 = pcVar2;
    } while (lVar4 != 0);
  }
  else {
    uVar7 = 0;
    pcVar3 = pcVar8;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (&local_70,0x20);
  if (pcVar3 < this->m_end) {
    do {
      cVar1 = *pcVar3;
      if ((cVar1 == '\n') || (cVar1 == '\r')) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::push_back
                (&local_70,cVar1);
      pcVar3 = pcVar3 + 1;
    } while (pcVar3 < this->m_end);
  }
  LogWriteLine(Error,local_70._M_dataplus._M_p);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (&local_50,0x20);
  if (uVar7 < this->m_columnMarker) {
    uVar6 = 0;
    do {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                (&local_50," ");
      uVar6 = uVar6 + 1;
      uVar5 = 0;
      if (uVar7 <= this->m_columnMarker) {
        uVar5 = this->m_columnMarker - uVar7;
      }
    } while (uVar6 < uVar5);
  }
  lVar4 = 3;
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (&local_50,"^");
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  LogWriteLine(Error,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    MemFree(local_50._M_dataplus._M_p,
            CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0])
            + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    MemFree(local_70._M_dataplus._M_p,
            CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0])
            + 1);
  }
  return;
}

Assistant:

inline_t void Lexer::ErrorWriteDetails() const
	{
		// Get line start position
		const char * current = m_start;
		const char * lineStart = m_start;
		while (current < m_current)
		{
			if (IsNewline(*current))
				lineStart = current + 1;
			++current;
		}
		size_t whitespaceOffset = 0;
		while (lineStart < m_current && IsWhitespace(*lineStart))
		{
			if (*lineStart == '\t')
				whitespaceOffset += 4;
			else
				++whitespaceOffset;
			++lineStart;
		}

		// Find line end
		String lineText;
		lineText.reserve(32);
		while (lineStart < m_end && !IsNewline(*lineStart))
		{
			lineText += *lineStart;
			++lineStart;
		}

		// Write line text
		LogWriteLine(LogLevel::Error, lineText.c_str());

		// Write marker showing location of error
		String markerText;
		markerText.reserve(32);
		for (size_t i = 0; i < std::max(size_t(m_columnMarker), whitespaceOffset) - whitespaceOffset; ++i)
			markerText += " ";
		for (size_t i = 0; i < 3; ++i)
			markerText += "^";
		LogWriteLine(LogLevel::Error, markerText.c_str());
	}